

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testStatsdClient.cpp
# Opt level: O1

int main(void)

{
  testErrorConditions();
  testReconfigure();
  testSendRecv(0,0);
  testSendRecv(0x20,1000);
  testSendRecv(0x10,0);
  return 0;
}

Assistant:

int main() {
    // If any of these tests fail they throw an exception, not catching makes for a nonzero return code

    // general things that should be errors
    testErrorConditions();
    // reconfiguring how you are sending
    testReconfigure();
    // no batching
    testSendRecv(0, 0);
    // background batching
    testSendRecv(32, 1000);
    // manual flushing of batches
    testSendRecv(16, 0);

    return EXIT_SUCCESS;
}